

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::computeFactor(HModel *this)

{
  long in_RDI;
  double dVar1;
  double dVar2;
  double invertTime;
  runtime_error *error;
  double tt0;
  HFactor *in_stack_000004d0;
  HTimer *in_stack_ffffffffffffffc0;
  
  dVar1 = HTimer::getTime(in_stack_ffffffffffffffc0);
  HFactor::build(in_stack_000004d0);
  *(undefined4 *)(in_RDI + 0x584) = 0;
  dVar2 = HTimer::getTime(in_stack_ffffffffffffffc0);
  *(int *)(in_RDI + 0x598) = *(int *)(in_RDI + 0x598) + 1;
  *(double *)(in_RDI + 0x5a0) = (dVar2 - dVar1) + *(double *)(in_RDI + 0x5a0);
  printf("           INVERT  %4d     on iteration %9d: INVERT  time = %11.4g; Total INVERT  time = %11.4g\n"
         ,dVar2 - dVar1,*(undefined8 *)(in_RDI + 0x5a0),(ulong)*(uint *)(in_RDI + 0x598),
         (ulong)*(uint *)(in_RDI + 0x588));
  *(undefined4 *)(in_RDI + 0x5f4) = 1;
  *(undefined4 *)(in_RDI + 0x5f8) = 1;
  return;
}

Assistant:

void HModel::computeFactor() {
#ifdef JAJH_dev
  //	double tt0 = timer.getTime();
#endif
	double tt0 = timer.getTime();
    try {
        factor.build();
    } catch (runtime_error& error) {
        cout << error.what() << endl;
        problemStatus = LP_Status_Singular;
        // TODO Change to return
#ifdef JAJH_dev
        writePivots("failed");
#endif
        exit(0);
    }
    //    printf("INVERT: After %d iterations and %d updates\n", numberIteration, countUpdate);
    countUpdate = 0;

    double invertTime = timer.getTime()-tt0;
    totalInverts++;
    totalInvertTime += invertTime;
#ifdef JAJH_dev
    printf("           INVERT  %4d     on iteration %9d: INVERT  time = %11.4g; Total INVERT  time = %11.4g\n",
	   totalInverts, numberIteration, invertTime, totalInvertTime);
#endif

    //Now have a representation of B^{-1}, and it is fresh!
    mlFg_haveInvert = 1;
    mlFg_haveFreshInvert = 1;
}